

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O0

QStringList * QCoreApplication::libraryPaths(void)

{
  long lVar1;
  QMutexLocker<QRecursiveMutex> *in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QRecursiveMutex> locker;
  QRecursiveMutex *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>_>::operator->
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>_> *)
             0x33e430);
  QMutexLocker<QRecursiveMutex>::QMutexLocker(in_RDI,in_stack_ffffffffffffffb8);
  libraryPathsLocked();
  QMutexLocker<QRecursiveMutex>::~QMutexLocker(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QStringList *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QCoreApplication::libraryPaths()
{
    QMutexLocker locker(&coreappdata->libraryPathMutex);
    return libraryPathsLocked();
}